

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O3

void testDeepTiledBasic(string *tempDir)

{
  int count;
  ThreadPool *pTVar1;
  string *extraout_RDX;
  string *tempDir_00;
  string *tempDir_01;
  string *tempDir_02;
  string *extraout_RDX_00;
  int testTimes;
  int iVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the DeepTiledInput/OutputFile for basic use",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  random_reseed(1);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  count = IlmThread_2_5::ThreadPool::numThreads(pTVar1);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(pTVar1,2);
  iVar2 = 4;
  tempDir_00 = extraout_RDX;
  do {
    testTimes = (int)tempDir;
    anon_unknown.dwarf_139a88::readWriteTestWithAbsoluateCoordinates(1,testTimes,tempDir_00);
    anon_unknown.dwarf_139a88::readWriteTestWithAbsoluateCoordinates(3,testTimes,tempDir_01);
    anon_unknown.dwarf_139a88::readWriteTestWithAbsoluateCoordinates(10,testTimes,tempDir_02);
    iVar2 = iVar2 + -1;
    tempDir_00 = extraout_RDX_00;
  } while (iVar2 != 0);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(pTVar1,count);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void testDeepTiledBasic (const std::string & tempDir)
{
    try
    {
        cout << "Testing the DeepTiledInput/OutputFile for basic use" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(2);

        for(int pass = 0 ; pass < 4 ; pass++)
        {
           readWriteTestWithAbsoluateCoordinates ( 1, 2, tempDir);
           readWriteTestWithAbsoluateCoordinates ( 3, 2, tempDir);
           readWriteTestWithAbsoluateCoordinates (10, 2, tempDir);
        }
        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}